

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::executor_function_tag>
                 (long param_1,long param_2,ulong param_3)

{
  ulong uVar1;
  void *pointer;
  void *__ptr;
  byte *pbVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  bad_alloc ex;
  
  uVar1 = param_2 + 3;
  if (param_1 != 0) {
    lVar5 = 0;
    do {
      pbVar2 = *(byte **)(param_1 + 0x20 + lVar5 * 8);
      if (((pbVar2 != (byte *)0x0) && (uVar1 >> 2 <= (ulong)*pbVar2)) &&
         ((ulong)pbVar2 % param_3 == 0)) {
        *(undefined8 *)(param_1 + 0x20 + lVar5 * 8) = 0;
        bVar6 = *pbVar2;
        goto LAB_0018dcef;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    __ptr = *(void **)(param_1 + 0x20);
    lVar5 = 4;
    if (__ptr == (void *)0x0) {
      __ptr = *(void **)(param_1 + 0x28);
      lVar5 = 5;
      if (__ptr == (void *)0x0) goto LAB_0018dcad;
    }
    *(undefined8 *)(param_1 + lVar5 * 8) = 0;
    free(__ptr);
  }
LAB_0018dcad:
  uVar4 = ((uVar1 & 0xfffffffffffffffc) + 1) % param_3;
  lVar5 = param_3 - uVar4;
  if (uVar4 == 0) {
    lVar5 = 0;
  }
  pbVar2 = (byte *)aligned_alloc(param_3,lVar5 + (uVar1 & 0xfffffffffffffffc) + 1);
  if (pbVar2 == (byte *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &std::istream::typeinfo;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  bVar6 = 0;
  if (uVar1 < 0x400) {
    bVar6 = (byte)(uVar1 >> 2);
  }
LAB_0018dcef:
  pbVar2[param_2] = bVar6;
  return pbVar2;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }